

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolArray.c
# Opt level: O2

void dePoolArray_selfTest(void)

{
  int **ppiVar1;
  deMemPool *pool;
  dePoolIntArray *pdVar2;
  dePoolInt16Array *arr;
  uint uVar3;
  int iVar4;
  
  pool = deMemPool_createRoot((deMemPoolUtil *)0x0,0);
  pdVar2 = dePoolIntArray_create(pool);
  arr = (dePoolInt16Array *)dePoolArray_create(pool,2);
  for (iVar4 = 0; iVar4 != 5000; iVar4 = iVar4 + 1) {
    deMemPool_alloc(pool,1);
    dePoolIntArray_pushBack(pdVar2,iVar4);
    dePoolInt16Array_pushBack(arr,(deInt16)iVar4);
  }
  if (pdVar2->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xae);
  }
  if (arr->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xaf);
  }
  for (uVar3 = 0; uVar3 != 5000; uVar3 = uVar3 + 1) {
    if (uVar3 != pdVar2->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb2);
    }
    if (uVar3 != (int)arr->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb3);
    }
  }
  for (iVar4 = 4999; iVar4 != 3999; iVar4 = iVar4 + -1) {
    uVar3 = pdVar2->numElements - 1;
    pdVar2->numElements = uVar3;
    if (iVar4 != pdVar2->pageTable[(int)uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolIntArray_popBack(arr) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xb9);
    }
    uVar3 = arr->numElements - 1;
    arr->numElements = uVar3;
    if (iVar4 != arr->pageTable[(int)uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolInt16Array_popBack(arr16) == (4999 - i)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xba);
    }
  }
  if (pdVar2->numElements != 4000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbd);
  }
  if (arr->numElements != 4000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 4000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xbe);
  }
  for (uVar3 = 0; uVar3 != 4000; uVar3 = uVar3 + 1) {
    if (uVar3 != pdVar2->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc1);
    }
    if (uVar3 != (int)arr->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xc2);
    }
  }
  dePoolIntArray_setSize(pdVar2,1000);
  if (arr->capacity < 1000) {
    dePoolArray_setSize((dePoolArray *)arr,1000);
  }
  else {
    arr->numElements = 1000;
  }
  for (iVar4 = 1000; iVar4 != 5000; iVar4 = iVar4 + 1) {
    dePoolIntArray_pushBack(pdVar2,iVar4);
    dePoolInt16Array_pushBack(arr,(deInt16)iVar4);
  }
  if (pdVar2->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xce);
  }
  if (arr->numElements != 5000) {
    deAssertFail("dePoolInt16Array_getNumElements(arr16) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xcf);
  }
  for (uVar3 = 0; uVar3 != 5000; uVar3 = uVar3 + 1) {
    if (uVar3 != pdVar2->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolIntArray_get(arr, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd2);
    }
    if (uVar3 != (int)arr->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("dePoolInt16Array_get(arr16, i) == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xd3);
    }
  }
  pdVar2 = dePoolIntArray_create(pool);
  dePoolIntArray_setSize(pdVar2,0x5dc);
  dePoolIntArray_reserve(pdVar2,2000);
  ppiVar1 = pdVar2->pageTable;
  for (uVar3 = 0; uVar3 != 0x5dc; uVar3 = uVar3 + 1) {
    ppiVar1[uVar3 >> 4][uVar3 & 0xf] = uVar3;
  }
  for (iVar4 = 0x5dc; iVar4 != 5000; iVar4 = iVar4 + 1) {
    dePoolIntArray_pushBack(pdVar2,iVar4);
  }
  if (pdVar2->numElements != 5000) {
    deAssertFail("dePoolIntArray_getNumElements(arr) == 5000",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                 ,0xdf);
  }
  for (uVar3 = 0; uVar3 != 5000; uVar3 = uVar3 + 1) {
    if (uVar3 != pdVar2->pageTable[uVar3 >> 4][uVar3 & 0xf]) {
      deAssertFail("val == i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/depool/dePoolArray.c"
                   ,0xe3);
    }
  }
  deMemPool_destroy(pool);
  return;
}

Assistant:

void dePoolArray_selfTest (void)
{
	deMemPool*			pool	= deMemPool_createRoot(DE_NULL, 0);
	dePoolIntArray*		arr		= dePoolIntArray_create(pool);
	dePoolInt16Array*	arr16	= dePoolInt16Array_create(pool);
	int					i;

	/* Test pushBack(). */
	for (i = 0; i < 5000; i++)
	{
		/* Dummy alloc to try to break alignments. */
		deMemPool_alloc(pool, 1);

		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test popBack(). */
	for (i = 0; i < 1000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_popBack(arr) == (4999 - i));
		DE_TEST_ASSERT(dePoolInt16Array_popBack(arr16) == (4999 - i));
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 4000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 4000);
	for (i = 0; i < 4000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test setSize(). */
	dePoolIntArray_setSize(arr, 1000);
	dePoolInt16Array_setSize(arr16, 1000);
	for (i = 1000; i < 5000; i++)
	{
		dePoolIntArray_pushBack(arr, i);
		dePoolInt16Array_pushBack(arr16, (deInt16)i);
	}

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	DE_TEST_ASSERT(dePoolInt16Array_getNumElements(arr16) == 5000);
	for (i = 0; i < 5000; i++)
	{
		DE_TEST_ASSERT(dePoolIntArray_get(arr, i) == i);
		DE_TEST_ASSERT(dePoolInt16Array_get(arr16, i) == i);
	}

	/* Test set() and pushBack() with reserve(). */
	arr = dePoolIntArray_create(pool);
	dePoolIntArray_setSize(arr, 1500);
	dePoolIntArray_reserve(arr, 2000);
	for (i = 0; i < 1500; i++)
		dePoolIntArray_set(arr, i, i);
	for (; i < 5000; i++)
		dePoolIntArray_pushBack(arr, i);

	DE_TEST_ASSERT(dePoolIntArray_getNumElements(arr) == 5000);
	for (i = 0; i < 5000; i++)
	{
		int val = dePoolIntArray_get(arr, i);
		DE_TEST_ASSERT(val == i);
	}

	deMemPool_destroy(pool);
}